

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertAlwaysTest.cpp
# Opt level: O0

void __thiscall
AssertAlwaysTest_assertLtShouldAbort_Test::AssertAlwaysTest_assertLtShouldAbort_Test
          (AssertAlwaysTest_assertLtShouldAbort_Test *this)

{
  AssertAlwaysTest_assertLtShouldAbort_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__AssertAlwaysTest_assertLtShouldAbort_Test_001d2fc8;
  return;
}

Assistant:

TEST(AssertAlwaysTest, assertLtShouldAbort)
{
    ::testing::FLAGS_gtest_death_test_style = "threadsafe";
    std::int32_t a = 2;
    std::int32_t b = 1;
    EXPECT_EXIT(
            CPP_ASSERT_ALWAYS_LT(a, b)
            ,::testing::KilledBySignal(SIGABRT)
            , ".*Assertion failure.*");

}